

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

int str_dump(lua_State *L)

{
  int iVar1;
  undefined4 local_440;
  int strip;
  str_Writer state;
  lua_State *L_local;
  
  state.B.init._1016_8_ = L;
  iVar1 = lua_toboolean(L,2);
  luaL_checktype((lua_State *)state.B.init._1016_8_,1,6);
  lua_settop((lua_State *)state.B.init._1016_8_,1);
  local_440 = 0;
  iVar1 = lua_dump((lua_State *)state.B.init._1016_8_,writer,&local_440,iVar1);
  if (iVar1 == 0) {
    luaL_pushresult((luaL_Buffer *)&state);
    L_local._4_4_ = 1;
  }
  else {
    L_local._4_4_ = luaL_error((lua_State *)state.B.init._1016_8_,"unable to dump given function");
  }
  return L_local._4_4_;
}

Assistant:

static int str_dump (lua_State *L) {
  struct str_Writer state;
  int strip = lua_toboolean(L, 2);
  luaL_checktype(L, 1, LUA_TFUNCTION);
  lua_settop(L, 1);  /* ensure function is on the top of the stack */
  state.init = 0;
  if (l_unlikely(lua_dump(L, writer, &state, strip) != 0))
    return luaL_error(L, "unable to dump given function");
  luaL_pushresult(&state.B);
  return 1;
}